

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O0

UBool __thiscall icu_63::Edits::copyErrorTo(Edits *this,UErrorCode *outErrorCode)

{
  UBool UVar1;
  UErrorCode *outErrorCode_local;
  Edits *this_local;
  
  UVar1 = ::U_FAILURE(*outErrorCode);
  if (UVar1 == '\0') {
    UVar1 = ::U_SUCCESS(this->errorCode_);
    if (UVar1 == '\0') {
      *outErrorCode = this->errorCode_;
      this_local._7_1_ = '\x01';
    }
    else {
      this_local._7_1_ = '\0';
    }
  }
  else {
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

UBool Edits::copyErrorTo(UErrorCode &outErrorCode) {
    if (U_FAILURE(outErrorCode)) { return TRUE; }
    if (U_SUCCESS(errorCode_)) { return FALSE; }
    outErrorCode = errorCode_;
    return TRUE;
}